

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int nodeVPush(xmlValidCtxtPtr ctxt,xmlNodePtr value)

{
  int iVar1;
  xmlNodePtr *ppxVar2;
  int newSize;
  xmlNodePtr *tmp;
  xmlNodePtr value_local;
  xmlValidCtxtPtr ctxt_local;
  
  if (ctxt->nodeMax <= ctxt->nodeNr) {
    iVar1 = xmlGrowCapacity(ctxt->nodeMax,8,4,1000000000);
    if (iVar1 < 0) {
      xmlVErrMemory(ctxt);
      return -1;
    }
    ppxVar2 = (xmlNodePtr *)(*xmlRealloc)(ctxt->nodeTab,(long)iVar1 << 3);
    if (ppxVar2 == (xmlNodePtr *)0x0) {
      xmlVErrMemory(ctxt);
      return -1;
    }
    ctxt->nodeTab = ppxVar2;
    ctxt->nodeMax = iVar1;
  }
  ctxt->nodeTab[ctxt->nodeNr] = value;
  ctxt->node = value;
  iVar1 = ctxt->nodeNr;
  ctxt->nodeNr = iVar1 + 1;
  return iVar1;
}

Assistant:

static int
nodeVPush(xmlValidCtxtPtr ctxt, xmlNodePtr value)
{
    if (ctxt->nodeNr >= ctxt->nodeMax) {
        xmlNodePtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->nodeMax, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
        if (newSize < 0) {
	    xmlVErrMemory(ctxt);
            return (-1);
        }
        tmp = xmlRealloc(ctxt->nodeTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
	    xmlVErrMemory(ctxt);
            return (-1);
        }
	ctxt->nodeTab = tmp;
        ctxt->nodeMax = newSize;
    }
    ctxt->nodeTab[ctxt->nodeNr] = value;
    ctxt->node = value;
    return (ctxt->nodeNr++);
}